

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O1

void __thiscall stk::StkFrames::StkFrames(StkFrames *this,uint nFrames,uint nChannels)

{
  StkFloat *pSVar1;
  size_t __nmemb;
  
  this->data_ = (StkFloat *)0x0;
  this->nFrames_ = (ulong)nFrames;
  this->nChannels_ = nChannels;
  __nmemb = (ulong)nChannels * (ulong)nFrames;
  this->size_ = __nmemb;
  this->bufferSize_ = __nmemb;
  if (__nmemb != 0) {
    pSVar1 = (StkFloat *)calloc(__nmemb,8);
    this->data_ = pSVar1;
  }
  this->dataRate_ = Stk::srate_;
  return;
}

Assistant:

StkFrames :: StkFrames( unsigned int nFrames, unsigned int nChannels )
  : data_( 0 ), nFrames_( nFrames ), nChannels_( nChannels )
{
  size_ = nFrames_ * nChannels_;
  bufferSize_ = size_;

  if ( size_ > 0 ) {
    data_ = (StkFloat *) calloc( size_, sizeof( StkFloat ) );
#if defined(_STK_DEBUG_)
    if ( data_ == NULL ) {
      std::string error = "StkFrames: memory allocation error in constructor!";
      Stk::handleError( error, StkError::MEMORY_ALLOCATION );
    }
#endif
  }

  dataRate_ = Stk::sampleRate();
}